

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringLifting.cpp
# Opt level: O2

void __thiscall wasm::StringLifting::run::StringApplier::~StringApplier(StringApplier *this)

{
  WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>::~WalkerPass
            (&this->
              super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
            );
  operator_delete(this,0x140);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }